

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtSwapVars(word *pTruth,int nVars,int iVar,int jVar)

{
  word *pwVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  word wVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  word (*pawVar11) [3];
  uint uVar12;
  int iVar13;
  long lVar14;
  byte bVar15;
  word *pwVar16;
  word *pwVar17;
  long lVar18;
  word *pwVar19;
  word *pwVar20;
  
  if (iVar != jVar) {
    iVar13 = iVar;
    if (iVar < jVar) {
      iVar13 = jVar;
    }
    if (jVar < iVar) {
      iVar = jVar;
    }
    if ((iVar13 <= iVar) || (nVars <= iVar13)) {
      __assert_fail("iVar < jVar && jVar < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x692,"void Abc_TtSwapVars(word *, int, int, int)");
    }
    if (nVars < 7) {
      wVar5 = Abc_Tt6SwapVars(*pTruth,iVar,iVar13);
      *pTruth = wVar5;
    }
    else {
      bVar7 = (byte)iVar;
      bVar15 = (byte)iVar13;
      if (iVar13 < 6) {
        bVar8 = (char)nVars - 6U & 0x1f;
        pawVar11 = s_PPMasks[iVar] + iVar13;
        bVar7 = (char)(-1 << (bVar7 & 0x1f)) + (char)(1 << (bVar15 & 0x1f));
        uVar10 = 0;
        uVar9 = (ulong)(uint)(1 << bVar8);
        if (1 << bVar8 < 1) {
          uVar9 = uVar10;
        }
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          uVar2 = pTruth[uVar10];
          pTruth[uVar10] =
               (uVar2 & (*pawVar11)[2]) >> (bVar7 & 0x3f) |
               ((*pawVar11)[1] & uVar2) << (bVar7 & 0x3f) | (*pawVar11)[0] & uVar2;
        }
      }
      else {
        pwVar1 = pTruth + (1 << ((char)nVars - 6U & 0x1f));
        if (iVar < 6) {
          uVar12 = 1 << (bVar15 - 6 & 0x1f);
          uVar9 = 0;
          if (0 < (int)uVar12) {
            uVar9 = (ulong)uVar12;
          }
          for (; pTruth < pwVar1; pTruth = pTruth + (2 << (bVar15 - 6 & 0x1f))) {
            for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
              uVar2 = pTruth[uVar10];
              uVar3 = s_Truths6[iVar];
              bVar8 = (byte)(1 << (bVar7 & 0x1f));
              uVar4 = pTruth[(long)(int)uVar12 + uVar10];
              pTruth[uVar10] = (uVar4 << (bVar8 & 0x3f) ^ uVar2) & uVar3 ^ uVar2;
              pTruth[(long)(int)uVar12 + uVar10] = uVar4 & uVar3 | (uVar3 & uVar2) >> (bVar8 & 0x3f)
              ;
            }
          }
        }
        else {
          bVar8 = bVar7 - 6 & 0x1f;
          uVar12 = 1 << bVar8;
          iVar13 = 2 << (bVar15 - 6 & 0x1f);
          uVar9 = 0;
          if (0 < 1 << bVar8) {
            uVar9 = (ulong)uVar12;
          }
          lVar14 = (long)(2 << (bVar7 - 6 & 0x1f));
          lVar6 = (long)(1 << (bVar15 - 6 & 0x1f));
          pwVar16 = pTruth + (int)uVar12;
          pwVar17 = pTruth + lVar6;
          for (; pTruth < pwVar1; pTruth = pTruth + iVar13) {
            pwVar19 = pwVar17;
            pwVar20 = pwVar16;
            for (lVar18 = 0; lVar18 < lVar6; lVar18 = lVar18 + lVar14) {
              for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
                wVar5 = pwVar20[uVar10];
                pwVar20[uVar10] = pwVar19[uVar10];
                pwVar19[uVar10] = wVar5;
              }
              pwVar20 = pwVar20 + lVar14;
              pwVar19 = pwVar19 + lVar14;
            }
            pwVar16 = pwVar16 + iVar13;
            pwVar17 = pwVar17 + iVar13;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtSwapVars( word * pTruth, int nVars, int iVar, int jVar )
{
    if ( iVar == jVar )
        return;
    if ( jVar < iVar )
        ABC_SWAP( int, iVar, jVar );
    assert( iVar < jVar && jVar < nVars );
    if ( nVars <= 6 )
    {
        pTruth[0] = Abc_Tt6SwapVars( pTruth[0], iVar, jVar );
        return;
    }
    if ( jVar <= 5 )
    {
        word * s_PMasks = s_PPMasks[iVar][jVar];
        int nWords = Abc_TtWordNum(nVars);
        int w, shift = (1 << jVar) - (1 << iVar);
        for ( w = 0; w < nWords; w++ )
            pTruth[w] = (pTruth[w] & s_PMasks[0]) | ((pTruth[w] & s_PMasks[1]) << shift) | ((pTruth[w] & s_PMasks[2]) >> shift);
        return;
    }
    if ( iVar <= 5 && jVar > 5 )
    {
        word low2High, high2Low;
        word * pLimit = pTruth + Abc_TtWordNum(nVars);
        int j, jStep = Abc_TtWordNum(jVar);
        int shift = 1 << iVar;
        for ( ; pTruth < pLimit; pTruth += 2*jStep )
            for ( j = 0; j < jStep; j++ )
            {
                low2High = (pTruth[j] & s_Truths6[iVar]) >> shift;
                high2Low = (pTruth[j+jStep] << shift) & s_Truths6[iVar];
                pTruth[j] = (pTruth[j] & ~s_Truths6[iVar]) | high2Low;
                pTruth[j+jStep] = (pTruth[j+jStep] & s_Truths6[iVar]) | low2High;
            }
        return;
    }
    {
        word * pLimit = pTruth + Abc_TtWordNum(nVars);
        int i, iStep = Abc_TtWordNum(iVar);
        int j, jStep = Abc_TtWordNum(jVar);
        for ( ; pTruth < pLimit; pTruth += 2*jStep )
            for ( i = 0; i < jStep; i += 2*iStep )
                for ( j = 0; j < iStep; j++ )
                    ABC_SWAP( word, pTruth[iStep + i + j], pTruth[jStep + i + j] );
        return;
    }    
}